

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_backend.cpp
# Opt level: O3

void __thiscall basisu::basisu_backend::create_encoder_blocks(basisu_backend *this)

{
  vector<basisu::vector2D<basisu::encoder_block>_> *this_00;
  vector2D<basisu::encoder_block> *pvVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  bool bVar4;
  basis_texture_type bVar5;
  uint32_t uVar6;
  vector2D<basisu::encoder_block> *pvVar7;
  void *__ptr;
  basisu_backend_slice_desc *pbVar8;
  vec2U *pvVar9;
  encoder_block *peVar10;
  pixel_block *ppVar11;
  endpoint_cluster_etc_params *peVar12;
  encoder_block *peVar13;
  uint32_t uVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  uint32_t uVar18;
  uint64_t uVar19;
  ulong uVar20;
  ulong uVar21;
  char cVar22;
  uint uVar23;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  char *pcVar27;
  uint uVar28;
  uint uVar29;
  int iVar30;
  ulong uVar31;
  int iVar32;
  uint uVar33;
  long lVar34;
  uint *puVar35;
  int iVar36;
  uint uVar37;
  long lVar38;
  ulong uVar39;
  uint uVar40;
  uint32_t new_size;
  encoder_block *peVar41;
  ulong uVar42;
  bool bVar43;
  float fVar44;
  undefined1 auVar45 [16];
  float fVar46;
  undefined1 auVar47 [16];
  float fVar48;
  uint_vec all_endpoint_indices;
  color_rgba pred_color;
  etc_block etc_blk;
  color_rgba trial_colors [16];
  interval_timer tm;
  uint local_12c;
  uint local_118;
  vector<unsigned_int> local_108;
  uint32_t local_f4;
  uint32_t local_f0;
  uint local_ec;
  uint local_e8;
  int local_e4;
  basisu_frontend *local_e0;
  ulong local_d8;
  anon_union_8_2_04352b30_for_etc_block_0 local_d0;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_c4;
  ulong local_c0;
  ulong local_b8;
  anon_union_8_2_04352b30_for_etc_block_0 local_b0;
  ulong local_a8;
  ulong local_a0;
  long local_98;
  ulong local_90;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_88 [16];
  interval_timer local_48;
  
  debug_printf("basisu_backend::create_encoder_blocks\n");
  interval_timer::interval_timer(&local_48);
  interval_timer::start(&local_48);
  local_e0 = this->m_pFront_end;
  bVar5 = (local_e0->m_params).m_tex_type;
  this_00 = &this->m_slice_encoder_blocks;
  uVar28 = (this->m_slices).m_size;
  uVar40 = (this->m_slice_encoder_blocks).m_size;
  uVar23 = uVar40 - uVar28;
  if (uVar23 != 0) {
    if (uVar40 < uVar28 || uVar23 == 0) {
      if ((this->m_slice_encoder_blocks).m_capacity < uVar28) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)this_00,uVar28,uVar40 + 1 == uVar28,0x18,
                   vector<basisu::vector2D<basisu::encoder_block>_>::object_mover,false);
        uVar40 = (this->m_slice_encoder_blocks).m_size;
      }
      if (uVar28 - uVar40 != 0) {
        memset(this_00->m_p + uVar40,0,
               (((ulong)(uVar28 - uVar40) * 0x18 - 0x18) / 0x18) * 0x18 + 0x18);
      }
    }
    else {
      pvVar7 = this_00->m_p;
      lVar38 = 0;
      do {
        __ptr = *(void **)((long)&pvVar7[uVar28].m_values.m_p + lVar38);
        if (__ptr != (void *)0x0) {
          free(__ptr);
        }
        lVar38 = lVar38 + 0x18;
      } while ((ulong)uVar23 * 0x18 != lVar38);
    }
    (this->m_slice_encoder_blocks).m_size = uVar28;
    uVar28 = (this->m_slices).m_size;
  }
  local_108.m_p = (uint *)0x0;
  local_108.m_size = 0;
  local_108.m_capacity = 0;
  uVar25 = 0;
  if (uVar28 != 0) {
    uVar28 = 0;
    do {
      uVar14 = get_total_blocks(this,(uint32_t)uVar25);
      uVar28 = uVar28 + uVar14;
      uVar40 = (uint32_t)uVar25 + 1;
      uVar25 = (ulong)uVar40;
    } while (uVar40 < (this->m_slices).m_size);
    uVar25 = (ulong)uVar28;
  }
  vector<unsigned_int>::reserve(&local_108,uVar25);
  uVar28 = (this->m_slices).m_size;
  uVar25 = (ulong)uVar28;
  if (uVar28 == 0) {
    uVar40 = 0;
    local_12c = 0;
    uVar28 = 0;
LAB_001fe609:
    fVar44 = 0.0;
    fVar46 = ((float)uVar40 * 100.0) / 0.0;
  }
  else {
    uVar42 = 0;
    uVar40 = 0;
    local_12c = 0;
    uVar28 = 0;
    do {
      uVar23 = (uint)uVar25;
      iVar15 = -1;
      if (bVar5 == cBASISTexTypeVideoFrames) {
        iVar15 = find_video_frame(this,(int)uVar42,-1);
        uVar23 = (this->m_slices).m_size;
      }
      if (uVar23 <= uVar42) {
        pcVar27 = 
        "T &basisu::vector<basisu::basisu_backend_slice_desc>::operator[](size_t) [T = basisu::basisu_backend_slice_desc]"
        ;
LAB_001fe73d:
        __assert_fail("i < m_size",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                      ,0x178,pcVar27);
      }
      if ((this->m_slice_encoder_blocks).m_size <= uVar42) {
LAB_001fe6f2:
        pcVar27 = 
        "T &basisu::vector<basisu::vector2D<basisu::encoder_block>>::operator[](size_t) [T = basisu::vector2D<basisu::encoder_block>]"
        ;
        goto LAB_001fe73d;
      }
      pbVar8 = (this->m_slices).m_p;
      bVar4 = pbVar8[uVar42].m_iframe;
      local_f4 = pbVar8[uVar42].m_first_block_index;
      uVar23 = pbVar8[uVar42].m_num_blocks_x;
      uVar14 = pbVar8[uVar42].m_num_blocks_y;
      local_98 = uVar42 * 0x18;
      vector2D<basisu::encoder_block>::resize(this_00->m_p + uVar42,uVar23,uVar14);
      uVar25 = uVar42;
      if (uVar14 != 0) {
        local_a8 = (ulong)iVar15;
        uVar33 = 0;
        local_f0 = local_f4;
        local_d8 = uVar42;
        do {
          if ((ulong)uVar23 != 0) {
            local_b8 = (ulong)local_f0 << 6 | 2;
            local_90 = (ulong)(uVar33 * uVar23 + local_f4);
            uVar31 = 0;
            do {
              if ((this->m_slice_encoder_blocks).m_size <= uVar25) goto LAB_001fe6f2;
              pvVar7 = this_00->m_p;
              if ((pvVar7[uVar42].m_width <= uVar31) || (pvVar7[uVar42].m_height <= uVar33)) {
LAB_001fe709:
                __assert_fail("x < m_width && y < m_height",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_enc.h"
                              ,0xd2a,
                              "T &basisu::vector2D<basisu::encoder_block>::operator()(uint32_t, uint32_t) [T = basisu::encoder_block]"
                             );
              }
              iVar30 = (int)uVar31;
              uVar24 = pvVar7[uVar42].m_width * uVar33 + iVar30;
              if (pvVar7[uVar42].m_values.m_size <= uVar24) {
LAB_001fe728:
                pcVar27 = 
                "T &basisu::vector<basisu::encoder_block>::operator[](size_t) [T = basisu::encoder_block]"
                ;
                goto LAB_001fe73d;
              }
              uVar16 = (int)local_90 + iVar30;
              if ((local_e0->m_block_endpoint_clusters_indices).m_size <= uVar16) {
LAB_001fe747:
                pcVar27 = 
                "const T &basisu::vector<basisu::vec2U>::operator[](size_t) const [T = basisu::vec2U]"
                ;
LAB_001fe801:
                __assert_fail("i < m_size",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                              ,0x177,pcVar27);
              }
              peVar41 = pvVar7[uVar42].m_values.m_p + uVar24;
              uVar6 = (local_e0->m_block_endpoint_clusters_indices).m_p[uVar16].m_comps[0];
              peVar41->m_endpoint_index = uVar6;
              if ((local_e0->m_block_endpoint_clusters_indices).m_size <= uVar16) goto LAB_001fe747;
              pvVar9 = (local_e0->m_block_endpoint_clusters_indices).m_p;
              if (pvVar9[uVar16].m_comps[0] != pvVar9[uVar16].m_comps[1]) {
                create_encoder_blocks();
LAB_001fe780:
                __assert_fail("!m_p || (&obj < m_p) || (&obj >= (m_p + m_size))",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                              ,0x267,
                              "void basisu::vector<unsigned int>::push_back(const T &) [T = unsigned int]"
                             );
              }
              if ((local_e0->m_block_selector_cluster_index).m_size <= uVar16) {
                pcVar27 = 
                "const T &basisu::vector<unsigned int>::operator[](size_t) const [T = unsigned int]"
                ;
                goto LAB_001fe801;
              }
              peVar41->m_selector_index = (local_e0->m_block_selector_cluster_index).m_p[uVar16];
              peVar41->m_endpoint_predictor = 3;
              puVar35 = (uint *)((long)&((this->m_slice_encoder_blocks).m_p)->m_width + local_98);
              uVar24 = 0xffffffff;
              lVar38 = 0;
              do {
                if (lVar38 == 2 && bVar5 == cBASISTexTypeVideoFrames) {
                  if (iVar15 != -1 && (bVar4 & 1U) == 0) {
                    uVar25 = (ulong)(this->m_slice_encoder_blocks).m_size;
                    if (uVar25 <= local_d8) goto LAB_001fe6f2;
                    pvVar7 = this_00->m_p;
                    if ((pvVar7[uVar42].m_width <= uVar31) || (pvVar7[uVar42].m_height <= uVar33))
                    goto LAB_001fe709;
                    uVar37 = pvVar7[uVar42].m_width * uVar33 + iVar30;
                    if (pvVar7[uVar42].m_values.m_size <= uVar37) goto LAB_001fe728;
                    if (uVar25 <= local_a8) goto LAB_001fe6f2;
                    if ((pvVar7[local_a8].m_width <= uVar31) ||
                       (pvVar7[local_a8].m_height <= uVar33)) goto LAB_001fe709;
                    pvVar1 = pvVar7 + local_a8;
                    uVar29 = pvVar7[local_a8].m_width * uVar33 + iVar30;
                    if ((pvVar1->m_values).m_size <= uVar29) goto LAB_001fe728;
                    peVar10 = pvVar7[uVar42].m_values.m_p + uVar37;
                    uVar25._0_4_ = peVar10->m_endpoint_index;
                    uVar25._4_4_ = peVar10->m_selector_index;
                    auVar45._8_8_ = 0;
                    auVar45._0_8_ = uVar25;
                    peVar10 = (pvVar1->m_values).m_p;
                    peVar13 = peVar10 + uVar29;
                    uVar2 = peVar13->m_endpoint_index;
                    uVar3 = peVar13->m_selector_index;
                    auVar47._0_4_ = -(uint)(uVar2 == (undefined4)uVar25);
                    auVar47._4_4_ = -(uint)(uVar3 == uVar25._4_4_);
                    auVar47._8_4_ = 0xffffffff;
                    auVar47._12_4_ = 0xffffffff;
                    auVar45 = pmovsxdq(auVar45,auVar47);
                    iVar17 = movmskpd((int)pvVar1,auVar45);
                    if (iVar17 == 3) {
                      peVar10[uVar29].m_is_cr_target = true;
                      uVar24 = 2;
                      goto LAB_001fe070;
                    }
                  }
                  break;
                }
                uVar37 = (char)(&g_endpoint_preds)[lVar38 * 2] + iVar30;
                if ((((-1 < (int)uVar37) && ((int)uVar37 < (int)uVar23)) &&
                    (uVar29 = (int)(char)(&DAT_00314899)[lVar38 * 2] + uVar33, -1 < (int)uVar29)) &&
                   ((int)uVar29 < (int)uVar14)) {
                  if ((this->m_slice_encoder_blocks).m_size <= local_d8) goto LAB_001fe6f2;
                  if ((*puVar35 <= uVar37) || (puVar35[1] <= uVar29)) goto LAB_001fe709;
                  uVar37 = *puVar35 * uVar29 + uVar37;
                  if (puVar35[4] <= uVar37) goto LAB_001fe728;
                  uVar29 = (uint)lVar38;
                  if (uVar24 <= (uint)lVar38) {
                    uVar29 = uVar24;
                  }
                  if (*(uint32_t *)(*(long *)(puVar35 + 2) + 4 + (ulong)uVar37 * 0x14) == uVar6) {
                    uVar24 = uVar29;
                  }
                }
                lVar38 = lVar38 + 1;
              } while (lVar38 != 3);
              if (uVar24 == 0xffffffff) {
                if ((this->m_params).m_endpoint_rdo_quality_thresh <= 0.0) {
                  uVar40 = uVar40 + 1;
                }
                else {
                  if ((local_e0->m_source_blocks).m_size <= uVar16) {
                    pcVar27 = 
                    "const T &basisu::vector<basisu::pixel_block>::operator[](size_t) const [T = basisu::pixel_block]"
                    ;
                    goto LAB_001fe801;
                  }
                  if ((local_e0->m_encoded_blocks).m_size <= uVar16) {
                    pcVar27 = 
                    "const T &basisu::vector<basisu::etc_block>::operator[](size_t) const [T = basisu::etc_block]"
                    ;
                    goto LAB_001fe801;
                  }
                  ppVar11 = (local_e0->m_source_blocks).m_p;
                  local_b0 = (anon_union_8_2_04352b30_for_etc_block_0)
                             (local_e0->m_encoded_blocks).m_p[uVar16].field_0.m_uint64;
                  uVar19 = etc_block::evaluate_etc1_error
                                     ((etc_block *)&local_b0,(color_rgba *)(ppVar11 + uVar16),
                                      (local_e0->m_params).m_perceptual,-1);
                  uVar25 = local_b8;
                  if (uVar19 != 0) {
                    fVar44 = (this->m_params).m_endpoint_rdo_quality_thresh;
                    fVar46 = 1.0;
                    if (1.0 <= fVar44) {
                      fVar46 = fVar44;
                    }
                    uVar20 = (ulong)(fVar46 * (float)uVar19);
                    uVar20 = (long)(fVar46 * (float)uVar19 - 9.223372e+18) & (long)uVar20 >> 0x3f |
                             uVar20;
                    local_d0 = local_b0;
                    local_118 = 0xffffffff;
                    local_c0 = 0xffffffffffffffff;
                    uVar39 = 0;
                    local_e4 = 0;
                    local_ec = uVar40;
                    local_e8 = uVar28;
                    do {
                      if (bVar5 == cBASISTexTypeVideoFrames && uVar39 == 2) break;
                      uVar28 = (char)(&g_endpoint_preds)[uVar39 * 2] + iVar30;
                      if (((-1 < (int)uVar28) && ((int)uVar28 < (int)uVar23)) &&
                         ((uVar40 = (int)(char)(&DAT_00314899)[uVar39 * 2] + uVar33,
                          -1 < (int)uVar40 && ((int)uVar40 < (int)uVar14)))) {
                        if ((this->m_slice_encoder_blocks).m_size <= local_d8) goto LAB_001fe6f2;
                        pvVar7 = this_00->m_p;
                        if ((pvVar7[uVar42].m_width <= uVar28) ||
                           (pvVar7[uVar42].m_height <= uVar40)) goto LAB_001fe709;
                        uVar28 = pvVar7[uVar42].m_width * uVar40 + uVar28;
                        if (pvVar7[uVar42].m_values.m_size <= uVar28) goto LAB_001fe728;
                        uVar28 = pvVar7[uVar42].m_values.m_p[uVar28].m_endpoint_index;
                        uVar26 = (ulong)uVar28;
                        if ((local_e0->m_endpoint_cluster_etc_params).m_size <= uVar28) {
                          pcVar27 = 
                          "const T &basisu::vector<basisu::basisu_frontend::endpoint_cluster_etc_params>::operator[](size_t) const [T = basisu::basisu_frontend::endpoint_cluster_etc_params]"
                          ;
                          goto LAB_001fe801;
                        }
                        peVar12 = (local_e0->m_endpoint_cluster_etc_params).m_p;
                        uVar28 = peVar12[uVar26].m_inten_table[0];
                        local_c4 = *(anon_union_4_2_6eba8969_for_color_rgba_0 *)(peVar12 + uVar26);
                        local_a0 = uVar26;
                        etc_block::set_block_color5
                                  ((etc_block *)&local_d0,(color_rgba *)&local_c4.field_1,
                                   (color_rgba *)&local_c4);
                        if (7 < uVar28) {
                          __assert_fail("t < 8",
                                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_etc.h"
                                        ,0xc1,
                                        "void basisu::etc_block::set_inten_table(uint32_t, uint32_t)"
                                       );
                        }
                        cVar22 = (char)uVar28;
                        local_d0.m_bytes[3] = cVar22 << 2 | cVar22 << 5 | local_d0.m_bytes[3] & 3;
                        unpack_etc1((etc_block *)&local_d0,(color_rgba *)&local_88[0].field_1,false)
                        ;
                        if ((local_e0->m_params).m_perceptual == false) {
                          uVar21 = 0;
                          uVar26 = 0;
                          do {
                            iVar32 = (uint)*(byte *)((long)(ppVar11->m_pixels + -1) +
                                                    uVar26 * 4 + uVar25 + 0xe) -
                                     (uint)local_88[0].m_comps[uVar26 * 4];
                            iVar36 = (uint)*(byte *)((long)(ppVar11->m_pixels + -1) +
                                                    uVar26 * 4 + uVar25 + 0xf) -
                                     (uint)local_88[0].m_comps[uVar26 * 4 + 1];
                            iVar17 = (uint)ppVar11->m_pixels[0][uVar26].field_0.m_comps[uVar25] -
                                     (uint)local_88[0].m_comps[uVar26 * 4 + 2];
                            uVar21 = (uint)(iVar17 * iVar17 + iVar36 * iVar36 + iVar32 * iVar32) +
                                     uVar21;
                            if (uVar20 < uVar21) break;
                            bVar43 = uVar26 < 0xf;
                            uVar26 = uVar26 + 1;
                          } while (bVar43);
                        }
                        else {
                          uVar21 = 0;
                          uVar26 = 0;
                          do {
                            iVar17 = (uint)*(byte *)((long)(ppVar11->m_pixels + -1) +
                                                    uVar26 * 4 + uVar25 + 0xe) -
                                     (uint)local_88[0].m_comps[uVar26 * 4];
                            iVar32 = (uint)ppVar11->m_pixels[0][uVar26].field_0.m_comps[uVar25] -
                                     (uint)local_88[0].m_comps[uVar26 * 4 + 2];
                            iVar36 = iVar32 * 9 + iVar17 * 0x1b +
                                     ((uint)*(byte *)((long)(ppVar11->m_pixels + -1) +
                                                     uVar26 * 4 + uVar25 + 0xf) -
                                     (uint)local_88[0].m_comps[uVar26 * 4 + 1]) * 0x5c;
                            lVar38 = (long)(iVar17 * 0x80 - iVar36);
                            lVar34 = (long)(iVar32 * 0x80 - iVar36);
                            uVar21 = (((uint)((int)((ulong)(lVar34 * lVar34) >> 7) * 3) >> 7) +
                                      (int)((ulong)((long)iVar36 * (long)iVar36) >> 7) +
                                     ((uint)((int)((ulong)(lVar38 * lVar38) >> 7) * 0x1a) >> 7)) +
                                     uVar21;
                            if (uVar20 < uVar21) break;
                            bVar43 = uVar26 < 0xf;
                            uVar26 = uVar26 + 1;
                          } while (bVar43);
                        }
                        if ((uVar21 <= uVar20) &&
                           ((uVar21 < local_c0 || ((uVar21 == local_c0 && (uVar39 < local_118))))))
                        {
                          local_118 = (uint)uVar39;
                          local_e4 = (int)local_a0;
                          local_c0 = uVar21;
                        }
                      }
                      uVar39 = uVar39 + 1;
                    } while (uVar39 != 3);
                    if (local_118 == 0xffffffff) {
                      uVar40 = local_ec + 1;
                      uVar28 = local_e8;
                    }
                    else {
                      peVar41->m_endpoint_index = local_e4;
                      peVar41->m_endpoint_predictor = local_118;
                      local_12c = local_12c + 1;
                      uVar28 = local_e8 + 1;
                      uVar40 = local_ec;
                    }
                  }
                }
                uVar24 = peVar41->m_endpoint_predictor;
              }
              else {
LAB_001fe070:
                peVar41->m_endpoint_predictor = uVar24;
                local_12c = local_12c + 1;
              }
              if (uVar24 == 3) {
                local_88[0] = (anon_union_4_2_6eba8969_for_color_rgba_0)peVar41->m_endpoint_index;
                uVar25 = local_108._8_8_ & 0xffffffff;
                if (local_88 < (anon_union_4_2_6eba8969_for_color_rgba_0 *)(local_108.m_p + uVar25)
                    && (local_108.m_p <= local_88 &&
                       (anon_union_4_2_6eba8969_for_color_rgba_0 *)local_108.m_p !=
                       (anon_union_4_2_6eba8969_for_color_rgba_0 *)0x0)) goto LAB_001fe780;
                if (local_108.m_capacity <= local_108.m_size) {
                  elemental_vector::increase_capacity
                            ((elemental_vector *)&local_108,local_108.m_size + 1,true,4,
                             (object_mover)0x0,false);
                  uVar25 = local_108._8_8_ & 0xffffffff;
                }
                *(anon_union_4_2_6eba8969_for_color_rgba_0 *)(local_108.m_p + uVar25) = local_88[0];
                local_108.m_size = local_108.m_size + 1;
              }
              uVar31 = uVar31 + 1;
              local_b8 = local_b8 + 0x40;
              uVar25 = local_d8;
            } while (uVar31 != uVar23);
          }
          uVar33 = uVar33 + 1;
          local_f0 = local_f0 + uVar23;
        } while (uVar33 != uVar14);
      }
      uVar42 = uVar25 + 1;
      uVar23 = (this->m_slices).m_size;
      uVar25 = (ulong)uVar23;
    } while (uVar42 < uVar25);
    if (uVar23 == 0) goto LAB_001fe609;
    uVar14 = 0;
    uVar23 = 0;
    do {
      uVar18 = get_total_blocks(this,uVar14);
      uVar23 = uVar23 + uVar18;
      uVar14 = uVar14 + 1;
      uVar33 = (this->m_slices).m_size;
    } while (uVar14 < uVar33);
    fVar46 = ((float)uVar40 * 100.0) / (float)uVar23;
    if (uVar33 == 0) {
      fVar44 = 0.0;
    }
    else {
      uVar14 = 0;
      uVar23 = 0;
      do {
        uVar18 = get_total_blocks(this,uVar14);
        uVar23 = uVar23 + uVar18;
        uVar14 = uVar14 + 1;
        uVar33 = (this->m_slices).m_size;
      } while (uVar14 < uVar33);
      fVar44 = (float)uVar23;
      if (uVar33 != 0) {
        uVar14 = 0;
        uVar23 = 0;
        do {
          uVar18 = get_total_blocks(this,uVar14);
          uVar23 = uVar23 + uVar18;
          uVar14 = uVar14 + 1;
        } while (uVar14 < (this->m_slices).m_size);
        fVar48 = (float)uVar23;
        goto LAB_001fe626;
      }
    }
  }
  fVar48 = 0.0;
LAB_001fe626:
  debug_printf("total_endpoint_pred_missed: %u (%3.2f%%) total_endpoint_pred_hit: %u (%3.2f%%), total_block_endpoints_remapped: %u (%3.2f%%)\n"
               ,(double)fVar46,(double)(((float)local_12c * 100.0) / fVar44),
               (double)(((float)uVar28 * 100.0) / fVar48),(ulong)uVar40,(ulong)local_12c,
               (ulong)uVar28);
  reoptimize_and_sort_endpoints_codebook(this,uVar28,&local_108);
  sort_selector_codebook(this);
  check_for_valid_cr_blocks(this);
  interval_timer::get_elapsed_secs(&local_48);
  debug_printf("Elapsed time: %3.3f secs\n");
  if ((anon_union_4_2_6eba8969_for_color_rgba_0 *)local_108.m_p !=
      (anon_union_4_2_6eba8969_for_color_rgba_0 *)0x0) {
    free(local_108.m_p);
  }
  return;
}

Assistant:

void basisu_backend::create_encoder_blocks()
	{
		debug_printf("basisu_backend::create_encoder_blocks\n");

		interval_timer tm;
		tm.start();

		basisu_frontend& r = *m_pFront_end;
		const bool is_video = r.get_params().m_tex_type == basist::cBASISTexTypeVideoFrames;

		m_slice_encoder_blocks.resize(m_slices.size());

		uint32_t total_endpoint_pred_missed = 0, total_endpoint_pred_hits = 0, total_block_endpoints_remapped = 0;

		uint_vec all_endpoint_indices;
		all_endpoint_indices.reserve(get_total_blocks());

		for (uint32_t slice_index = 0; slice_index < m_slices.size(); slice_index++)
		{
			const int prev_frame_slice_index = is_video ? find_video_frame(slice_index, -1) : -1;
			const bool is_iframe = m_slices[slice_index].m_iframe;
			const uint32_t first_block_index = m_slices[slice_index].m_first_block_index;

			//const uint32_t width = m_slices[slice_index].m_width;
			//const uint32_t height = m_slices[slice_index].m_height;
			const uint32_t num_blocks_x = m_slices[slice_index].m_num_blocks_x;
			const uint32_t num_blocks_y = m_slices[slice_index].m_num_blocks_y;

			m_slice_encoder_blocks[slice_index].resize(num_blocks_x, num_blocks_y);

			for (uint32_t block_y = 0; block_y < num_blocks_y; block_y++)
			{
				for (uint32_t block_x = 0; block_x < num_blocks_x; block_x++)
				{
					const uint32_t block_index = first_block_index + block_x + block_y * num_blocks_x;

					encoder_block& m = m_slice_encoder_blocks[slice_index](block_x, block_y);

					m.m_endpoint_index = r.get_subblock_endpoint_cluster_index(block_index, 0);
					BASISU_BACKEND_VERIFY(r.get_subblock_endpoint_cluster_index(block_index, 0) == r.get_subblock_endpoint_cluster_index(block_index, 1));

					m.m_selector_index = r.get_block_selector_cluster_index(block_index);

					m.m_endpoint_predictor = basist::NO_ENDPOINT_PRED_INDEX;

					const uint32_t block_endpoint = m.m_endpoint_index;

					uint32_t best_endpoint_pred = UINT32_MAX;

					for (uint32_t endpoint_pred = 0; endpoint_pred < basist::NUM_ENDPOINT_PREDS; endpoint_pred++)
					{
						if ((is_video) && (endpoint_pred == basist::CR_ENDPOINT_PRED_INDEX))
						{
							if ((prev_frame_slice_index != -1) && (!is_iframe))
							{
								const uint32_t cur_endpoint = m_slice_encoder_blocks[slice_index](block_x, block_y).m_endpoint_index;
								const uint32_t cur_selector = m_slice_encoder_blocks[slice_index](block_x, block_y).m_selector_index;
								const uint32_t prev_endpoint = m_slice_encoder_blocks[prev_frame_slice_index](block_x, block_y).m_endpoint_index;
								const uint32_t prev_selector = m_slice_encoder_blocks[prev_frame_slice_index](block_x, block_y).m_selector_index;
								if ((cur_endpoint == prev_endpoint) && (cur_selector == prev_selector))
								{
									best_endpoint_pred = basist::CR_ENDPOINT_PRED_INDEX;
									m_slice_encoder_blocks[prev_frame_slice_index](block_x, block_y).m_is_cr_target = true;
								}
							}
						}
						else
						{
							int pred_block_x = block_x + g_endpoint_preds[endpoint_pred].m_dx;
							if ((pred_block_x < 0) || (pred_block_x >= (int)num_blocks_x))
								continue;

							int pred_block_y = block_y + g_endpoint_preds[endpoint_pred].m_dy;
							if ((pred_block_y < 0) || (pred_block_y >= (int)num_blocks_y))
								continue;

							uint32_t pred_endpoint = m_slice_encoder_blocks[slice_index](pred_block_x, pred_block_y).m_endpoint_index;

							if (pred_endpoint == block_endpoint)
							{
								if (endpoint_pred < best_endpoint_pred)
								{
									best_endpoint_pred = endpoint_pred;
								}
							}
						}

					} // endpoint_pred

					if (best_endpoint_pred != UINT32_MAX)
					{
						m.m_endpoint_predictor = best_endpoint_pred;

						total_endpoint_pred_hits++;
					}
					else if (m_params.m_endpoint_rdo_quality_thresh > 0.0f)
					{
						const pixel_block& src_pixels = r.get_source_pixel_block(block_index);

						etc_block etc_blk(r.get_output_block(block_index));

						uint64_t cur_err = etc_blk.evaluate_etc1_error(src_pixels.get_ptr(), r.get_params().m_perceptual);

						if (cur_err)
						{
							const uint64_t thresh_err = (uint64_t)(cur_err * maximum(1.0f, m_params.m_endpoint_rdo_quality_thresh));

							etc_block trial_etc_block(etc_blk);

							uint64_t best_err = UINT64_MAX;
							uint32_t best_endpoint_index = 0;

							best_endpoint_pred = UINT32_MAX;

							for (uint32_t endpoint_pred = 0; endpoint_pred < basist::NUM_ENDPOINT_PREDS; endpoint_pred++)
							{
								if ((is_video) && (endpoint_pred == basist::CR_ENDPOINT_PRED_INDEX))
									continue;

								int pred_block_x = block_x + g_endpoint_preds[endpoint_pred].m_dx;
								if ((pred_block_x < 0) || (pred_block_x >= (int)num_blocks_x))
									continue;

								int pred_block_y = block_y + g_endpoint_preds[endpoint_pred].m_dy;
								if ((pred_block_y < 0) || (pred_block_y >= (int)num_blocks_y))
									continue;

								uint32_t pred_endpoint_index = m_slice_encoder_blocks[slice_index](pred_block_x, pred_block_y).m_endpoint_index;

								uint32_t pred_inten = r.get_endpoint_cluster_inten_table(pred_endpoint_index, false);
								color_rgba pred_color = r.get_endpoint_cluster_unscaled_color(pred_endpoint_index, false);

								trial_etc_block.set_block_color5(pred_color, pred_color);
								trial_etc_block.set_inten_table(0, pred_inten);
								trial_etc_block.set_inten_table(1, pred_inten);

								color_rgba trial_colors[16];
								unpack_etc1(trial_etc_block, trial_colors);

								uint64_t trial_err = 0;
								if (r.get_params().m_perceptual)
								{
									for (uint32_t p = 0; p < 16; p++)
									{
										trial_err += color_distance(true, src_pixels.get_ptr()[p], trial_colors[p], false);
										if (trial_err > thresh_err)
											break;
									}
								}
								else
								{
									for (uint32_t p = 0; p < 16; p++)
									{
										trial_err += color_distance(false, src_pixels.get_ptr()[p], trial_colors[p], false);
										if (trial_err > thresh_err)
											break;
									}
								}

								if (trial_err <= thresh_err)
								{
									if ((trial_err < best_err) || ((trial_err == best_err) && (endpoint_pred < best_endpoint_pred)))
									{
										best_endpoint_pred = endpoint_pred;
										best_err = trial_err;
										best_endpoint_index = pred_endpoint_index;
									}
								}
							} // endpoint_pred

							if (best_endpoint_pred != UINT32_MAX)
							{
								m.m_endpoint_index = best_endpoint_index;
								m.m_endpoint_predictor = best_endpoint_pred;

								total_endpoint_pred_hits++;
								total_block_endpoints_remapped++;
							}
							else
							{
								total_endpoint_pred_missed++;
							}
						}
					}
					else
					{
						total_endpoint_pred_missed++;
					}

					if (m.m_endpoint_predictor == basist::NO_ENDPOINT_PRED_INDEX)
					{
						all_endpoint_indices.push_back(m.m_endpoint_index);
					}

				} // block_x

			} // block_y

		} // slice

		debug_printf("total_endpoint_pred_missed: %u (%3.2f%%) total_endpoint_pred_hit: %u (%3.2f%%), total_block_endpoints_remapped: %u (%3.2f%%)\n",
			total_endpoint_pred_missed, total_endpoint_pred_missed * 100.0f / get_total_blocks(),
			total_endpoint_pred_hits, total_endpoint_pred_hits * 100.0f / get_total_blocks(),
			total_block_endpoints_remapped, total_block_endpoints_remapped * 100.0f / get_total_blocks());

		reoptimize_and_sort_endpoints_codebook(total_block_endpoints_remapped, all_endpoint_indices);

		sort_selector_codebook();
		check_for_valid_cr_blocks();
		
		debug_printf("Elapsed time: %3.3f secs\n", tm.get_elapsed_secs());
	}